

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

long * __thiscall
google::protobuf::Map<std::__cxx11::string,long>::at<std::__cxx11::string>
          (Map<std::__cxx11::string,long> *this,key_arg<std::__cxx11::basic_string<char>_> *key)

{
  LogMessage *pLVar1;
  LogFinisher local_81;
  string local_80;
  const_iterator it;
  LogMessage local_48;
  
  InnerMap::find<std::__cxx11::string>(&it.it_,(InnerMap *)this,key);
  if (it.it_.node_ == (Node *)0x0) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x4cb);
    pLVar1 = internal::LogMessage::operator<<(&local_48,"CHECK failed: it != end(): ");
    pLVar1 = internal::LogMessage::operator<<(pLVar1,"key not found: ");
    std::__cxx11::string::string((string *)&local_80,(string *)key);
    pLVar1 = internal::LogMessage::operator<<(pLVar1,&local_80);
    internal::LogFinisher::operator=(&local_81,pLVar1);
    std::__cxx11::string::~string((string *)&local_80);
    internal::LogMessage::~LogMessage(&local_48);
  }
  return (long *)&(it.it_.node_)->field_0x20;
}

Assistant:

const T& at(const key_arg<K>& key) const {
    const_iterator it = find(key);
    GOOGLE_CHECK(it != end()) << "key not found: " << static_cast<Key>(key);
    return it->second;
  }